

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void wallet::RefreshMempoolStatus(CWalletTx *tx,Chain *chain)

{
  uint256 *puVar1;
  ulong uVar2;
  TxStateInMempool *pTVar3;
  CWalletTx *in_RSI;
  variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
  *in_RDI;
  long in_FS_OFFSET;
  CWalletTx *__rhs;
  TxStateInactive *in_stack_fffffffffffffff0;
  variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
  *this;
  
  this = *(variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           **)(in_FS_OFFSET + 0x28);
  __rhs = in_RSI;
  CWalletTx::GetHash(in_RSI);
  puVar1 = transaction_identifier::operator_cast_to_uint256_
                     ((transaction_identifier<false> *)in_RSI);
  uVar2 = (**(code **)(*(long *)&(in_RSI->mapValue)._M_t._M_impl + 0x98))(in_RSI,puVar1);
  if ((uVar2 & 1) == 0) {
    pTVar3 = CWalletTx::state<wallet::TxStateInMempool>(in_RSI);
    if (pTVar3 != (TxStateInMempool *)0x0) {
      TxStateInactive::TxStateInactive((TxStateInactive *)in_RSI,false);
      std::
      variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
      ::operator=(this,in_stack_fffffffffffffff0);
    }
  }
  else {
    std::
    variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
    ::operator=(in_RDI,(TxStateInMempool *)__rhs);
  }
  if (*(variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
        **)(in_FS_OFFSET + 0x28) != this) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void RefreshMempoolStatus(CWalletTx& tx, interfaces::Chain& chain)
{
    if (chain.isInMempool(tx.GetHash())) {
        tx.m_state = TxStateInMempool();
    } else if (tx.state<TxStateInMempool>()) {
        tx.m_state = TxStateInactive();
    }
}